

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O2

double gamma_log(double x)

{
  long lVar1;
  char *__format;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if (x < 0.0) {
    __format = "Input must be Positive and Real";
  }
  else {
    if (x <= 1.79e+308) {
      if (x <= 2.22e-16) {
        dVar2 = log(x);
        dVar2 = -dVar2;
      }
      else {
        dVar2 = x;
        if (x <= 0.5) {
          dVar4 = 0.0;
          dVar3 = 1.0;
          for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 8) {
            dVar4 = dVar4 * x + *(double *)((long)&DAT_00150360 + lVar1);
            dVar3 = dVar3 * x + *(double *)((long)&DAT_001503a0 + lVar1);
          }
          dVar2 = log(x);
          dVar2 = ((dVar4 / dVar3) * x + -0.5772156649015329) * x - dVar2;
        }
      }
      if ((0.5 < x) && (x <= 0.6796875)) {
        dVar5 = x + -0.5 + -0.5;
        dVar4 = 0.0;
        dVar3 = 1.0;
        for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 8) {
          dVar4 = dVar4 * dVar5 + *(double *)((long)&DAT_001503e0 + lVar1);
          dVar3 = dVar3 * dVar5 + *(double *)((long)&DAT_00150420 + lVar1);
        }
        dVar2 = log(x);
        dVar2 = ((dVar4 / dVar3) * dVar5 + 0.42278433509846713) * dVar5 - dVar2;
      }
      if ((0.6796875 < x) && (x <= 1.5)) {
        dVar2 = x + -0.5 + -0.5;
        dVar4 = 0.0;
        dVar3 = 1.0;
        for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 8) {
          dVar4 = dVar4 * dVar2 + *(double *)((long)&DAT_00150360 + lVar1);
          dVar3 = dVar3 * dVar2 + *(double *)((long)&DAT_001503a0 + lVar1);
        }
        dVar2 = ((dVar4 / dVar3) * dVar2 + -0.5772156649015329) * dVar2;
      }
      if ((1.5 < x) && (x <= 4.0)) {
        dVar2 = x + -2.0;
        dVar4 = 0.0;
        dVar3 = 1.0;
        for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 8) {
          dVar4 = dVar4 * dVar2 + *(double *)((long)&DAT_001503e0 + lVar1);
          dVar3 = dVar3 * dVar2 + *(double *)((long)&DAT_00150420 + lVar1);
        }
        dVar2 = ((dVar4 / dVar3) * dVar2 + 0.42278433509846713) * dVar2;
      }
      if ((4.0 < x) && (x <= 12.0)) {
        dVar4 = x + -4.0;
        dVar2 = 0.0;
        dVar3 = -1.0;
        for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 8) {
          dVar2 = dVar2 * dVar4 + *(double *)((long)&DAT_00150460 + lVar1);
          dVar3 = dVar3 * dVar4 + *(double *)((long)&DAT_001504a0 + lVar1);
        }
        dVar2 = dVar4 * (dVar2 / dVar3) + 1.791759469228055;
      }
      if (12.0 < x) {
        dVar2 = 0.0;
        if (x <= 1.1567e+77) {
          dVar2 = 0.0057083835261;
          for (lVar1 = 0; lVar1 != 0x30; lVar1 = lVar1 + 8) {
            dVar2 = dVar2 / (x * x) + *(double *)((long)&DAT_001504e0 + lVar1);
          }
        }
        dVar3 = log(x);
        dVar2 = (dVar3 + -1.0) * x + dVar3 * -0.5 + 0.9189385332046728 + dVar2 / x;
      }
      return dVar2;
    }
    __format = "Overflow";
  }
  printf(__format);
  exit(1);
}

Assistant:

double gamma_log(double x) {
	/*
	 * This C program code is based on  W J Cody's fortran code.
	 * http://www.netlib.org/specfun/gamma
	 * 
	 *      References:                                                                                                                                  *
      [1] "Chebyshev Approximations for the Natural Logarithm of the Gamma    
           Function", W. J. Cody and K. E. Hillstrom, Math. Comp. 21, 1967,   
           pp. 198-203.                                                       
                                                                              
      [2] K. E. Hillstrom, ANL/AMD Program ANLC366S, DGAMMA/DLGAMA, May 1969. 
                                                                              
      [3] Hart, Et. Al., Computer Approximations, Wiley and sons, New York,   
          1968.                                                               
   */ 
   
	// numerator and denominator coefficients for 1 <= x <= 2
	
	double y,oup,fact,y2,nsum,dsum;
	int i;
	
	double spi = 0.9189385332046727417803297;
    double pi  = 3.1415926535897932384626434;
	double xmax = 171.624e+0;
	double xinf = 1.79e308;
	double eps = 2.22e-16;
	double xinf4 = 1.1567e+077;
	double pnt = 0.6796875e+0;
	
	double d1 = -5.772156649015328605195174e-1;
	
	// Coefficients for 0.5 < x <= 1.5
	
	double p1[8] = { 4.945235359296727046734888e+0,
                        2.018112620856775083915565e+2,
                        2.290838373831346393026739e+3,
                        1.131967205903380828685045e+4,
                        2.855724635671635335736389e+4,
                        3.848496228443793359990269e+4,
                        2.637748787624195437963534e+4,
                        7.225813979700288197698961e+3 };
                        
    double q1[8] = { 6.748212550303777196073036e+1,
                        1.113332393857199323513008e+3,
                        7.738757056935398733233834e+3,
                        2.763987074403340708898585e+4,
                        5.499310206226157329794414e+4,
                        6.161122180066002127833352e+4,
                        3.635127591501940507276287e+4,
                        8.785536302431013170870835e+3 };            
                        
	// Coefficients for 1.5 < x <= 4.0
	
	double d2 = 4.227843350984671393993777e-1;
	
	double p2[8] = { 4.974607845568932035012064e+0,
                        5.424138599891070494101986e+2,
                        1.550693864978364947665077e+4,
                        1.847932904445632425417223e+5,
                        1.088204769468828767498470e+6,
                        3.338152967987029735917223e+6,
                        5.106661678927352456275255e+6,
                        3.074109054850539556250927e+6 };
                        
    double q2[8] = { 1.830328399370592604055942e+2,
                        7.765049321445005871323047e+3,
                        1.331903827966074194402448e+5,
                        1.136705821321969608938755e+6,
                        5.267964117437946917577538e+6,
                        1.346701454311101692290052e+7,
                        1.782736530353274213975932e+7,
                        9.533095591844353613395747e+6 };                 
    
                        
	// Coefficients for 4.0 < x <= 12.0
	
	double d4 = 1.791759469228055000094023e+0;

	double p4[8] = { 1.474502166059939948905062e+04,
                        2.426813369486704502836312e+06,
                        1.214755574045093227939592e+08,
                        2.663432449630976949898078e+09,
                        2.940378956634553899906876e+10,
                        1.702665737765398868392998e+11,
                        4.926125793377430887588120e+11,
                        5.606251856223951465078242e+11 };
	
	double q4[8] = { 2.690530175870899333379843e+03,
                        6.393885654300092398984238e+05,
                        4.135599930241388052042842e+07,
                        1.120872109616147941376570e+09,
                        1.488613728678813811542398e+10,
                        1.016803586272438228077304e+11,
                        3.417476345507377132798597e+11,
                        4.463158187419713286462081e+11 };
                       
    // Coefficients for Hart's Minimax approximation x >= 12       
    
    
	double c[7] = { -1.910444077728e-03,
                        8.4171387781295e-04,
                       -5.952379913043012e-04,
                        7.93650793500350248e-04,
                       -2.777777777777681622553e-03,
                        8.333333333333333331554247e-02,
                        5.7083835261e-03 };     
	
	oup = x;
	
	if (x < 0) {
		printf("Input must be Positive and Real");
		exit(1);
	}
	
	if (x > xinf) {
		printf("Overflow");
		exit(1);
	}
	
	if (x <= eps) {
		oup = - log(x);
	}
	
	if ( x > eps && x <= 0.5) {
		y = x;
		nsum = 0.0;
		dsum = 1.0;
		
		for (i = 0; i < 8; ++i) {
			nsum = nsum * y + p1[i];
			dsum = dsum * y + q1[i];
		}
		
		oup = -log(y) + (y * (d1 + y * (nsum / dsum))); 
		
	}
	
	if ( x > 0.5 && x <= pnt) {
		y = (x - 0.5) - 0.5;
		nsum = 0.0;
		dsum = 1.0;
		
		for (i = 0; i < 8; ++i) {
			nsum = nsum * y + p2[i];
			dsum = dsum * y + q2[i];
		}
		
		oup = -log(x) + (y * (d2 + y * (nsum / dsum))); 
		
	}
	
	if ( x > pnt && x <= 1.5) {
		y = (x - 0.5) - 0.5;;
		nsum = 0.0;
		dsum = 1.0;
		
		for (i = 0; i < 8; ++i) {
			nsum = nsum * y + p1[i];
			dsum = dsum * y + q1[i];
		}
		
		oup = (y * (d1 + y * (nsum / dsum))); 
		
	}
	
	if ( x > 1.5 && x <= 4.0) {
		y = x - 2.;
		nsum = 0.0;
		dsum = 1.0;
		
		for (i = 0; i < 8; ++i) {
			nsum = nsum * y + p2[i];
			dsum = dsum * y + q2[i];
		}
		
		oup = (y * (d2 + y * (nsum / dsum))); 
		
	}
	
	if ( x > 4.0 && x <= 12.0) {
		y = x - 4.;
		nsum = 0.0;
		dsum = -1.0;
		
		for (i = 0; i < 8; ++i) {
			nsum = nsum * y + p4[i];
			dsum = dsum * y + q4[i];
		}
		
		oup = d4 + y * (nsum / dsum); 
		
	}
	
	if (x > 12.0) {
		oup = 0.0;
		y = x;
		if (y <= xinf4) {
			oup = c[6];
            y2 = y * y;
			for ( i = 0; i < 6; i++ ) {
				oup = oup / y2 + c[i];
			}
		}
		oup /= y;
		fact = log(y);
		oup += spi - 0.5 * fact + y * (fact - 1.0);
		
	}
	
	return oup;
                        

}